

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_service.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ServiceGenerator::Generate
          (ServiceGenerator *this,Printer *printer)

{
  FileDescriptor *descriptor;
  char *__s;
  string sStack_58;
  allocator<char> local_38 [32];
  
  __s = "static";
  if (*(char *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0x88) + 0x54) != '\0') {
    __s = "";
  }
  WriteServiceDocComment(printer,this->descriptor_);
  std::__cxx11::string::string<std::allocator<char>>((string *)&sStack_58,__s,local_38);
  google::protobuf::io::Printer::Print
            ((char *)printer,
             "public $static$ abstract class $classname$\n    implements com.google.protobuf.Service {\n"
             ,(string *)"static",(char *)&sStack_58,(string *)"classname");
  std::__cxx11::string::~string((string *)&sStack_58);
  google::protobuf::io::Printer::Indent();
  google::protobuf::io::Printer::Print
            ((char *)printer,"protected $classname$() {}\n\n",(string *)"classname");
  GenerateInterface(this,printer);
  GenerateNewReflectiveServiceMethod(this,printer);
  GenerateNewReflectiveBlockingServiceMethod(this,printer);
  GenerateAbstractMethods(this,printer);
  ClassName_abi_cxx11_(&sStack_58,*(java **)(this->descriptor_ + 0x10),descriptor);
  google::protobuf::SimpleItoa_abi_cxx11_((int)local_38);
  google::protobuf::io::Printer::Print
            ((char *)printer,
             "public static final\n    com.google.protobuf.Descriptors.ServiceDescriptor\n    getDescriptor() {\n  return $file$.getDescriptor().getServices().get($index$);\n}\n"
             ,(string *)0x17b4d2,(char *)&sStack_58,(string *)0x16ffe3);
  std::__cxx11::string::~string((string *)local_38);
  std::__cxx11::string::~string((string *)&sStack_58);
  google::protobuf::io::Printer::Print((char *)printer);
  GenerateCallMethod(this,printer);
  GenerateGetPrototype(this,REQUEST,printer);
  GenerateGetPrototype(this,RESPONSE,printer);
  GenerateStub(this,printer);
  GenerateBlockingStub(this,printer);
  google::protobuf::io::Printer::Print
            ((char *)printer,"\n// @@protoc_insertion_point(class_scope:$full_name$)\n",
             (string *)0x170969);
  google::protobuf::io::Printer::Outdent();
  google::protobuf::io::Printer::Print((char *)printer);
  return;
}

Assistant:

void ServiceGenerator::Generate(io::Printer* printer) {
  bool is_own_file = descriptor_->file()->options().java_multiple_files();
  WriteServiceDocComment(printer, descriptor_);
  printer->Print(
    "public $static$ abstract class $classname$\n"
    "    implements com.google.protobuf.Service {\n",
    "static", is_own_file ? "" : "static",
    "classname", descriptor_->name());
  printer->Indent();

  printer->Print(
    "protected $classname$() {}\n\n",
    "classname", descriptor_->name());

  GenerateInterface(printer);

  GenerateNewReflectiveServiceMethod(printer);
  GenerateNewReflectiveBlockingServiceMethod(printer);

  GenerateAbstractMethods(printer);

  // Generate getDescriptor() and getDescriptorForType().
  printer->Print(
    "public static final\n"
    "    com.google.protobuf.Descriptors.ServiceDescriptor\n"
    "    getDescriptor() {\n"
    "  return $file$.getDescriptor().getServices().get($index$);\n"
    "}\n",
    "file", ClassName(descriptor_->file()),
    "index", SimpleItoa(descriptor_->index()));
  GenerateGetDescriptorForType(printer);

  // Generate more stuff.
  GenerateCallMethod(printer);
  GenerateGetPrototype(REQUEST, printer);
  GenerateGetPrototype(RESPONSE, printer);
  GenerateStub(printer);
  GenerateBlockingStub(printer);

  // Add an insertion point.
  printer->Print(
    "\n"
    "// @@protoc_insertion_point(class_scope:$full_name$)\n",
    "full_name", descriptor_->full_name());

  printer->Outdent();
  printer->Print("}\n\n");
}